

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

OutputVariable * __thiscall
anon_unknown.dwarf_98ff53::ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
Parse<2>(OutputVariable *__return_storage_ptr__,
        ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable> *this,
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable> *this_local;
  
  CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>::Parse<2>
            (__return_storage_ptr__,
             &this->super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>,args);
  return __return_storage_ptr__;
}

Assistant:

Result Parse(std::vector<std::string> const& args) const
  {
    return this->CMakePathArgumentParser<Result>::template Parse<Advance>(
      args);
  }